

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  long *plVar1;
  TestRunStats *this_00;
  TestRunInfo *in_RDI;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  Totals *in_stack_ffffffffffffff60;
  AssertionResult *this_01;
  undefined1 local_70 [8];
  undefined1 local_68 [104];
  
  *(undefined ***)&in_RDI->name = &PTR__RunContext_002c37e0;
  (in_RDI->name)._M_string_length = (size_type)&DAT_002c3848;
  this_00 = (TestRunStats *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)&in_RDI[0xd].name._M_string_length);
  (**(code **)(*(long *)&in_RDI->name + 0x50))();
  TestRunStats::TestRunStats
            (this_00,in_RDI,in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  (*this_00->_vptr_TestRunStats[0xf])(this_00,local_68);
  TestRunStats::~TestRunStats((TestRunStats *)0x25ae0f);
  plVar1 = *(long **)&in_RDI[1].name.field_2;
  (**(code **)(*plVar1 + 0x40))(plVar1,in_RDI[0xe].name._M_string_length);
  this_01 = *(AssertionResult **)&in_RDI[1].name.field_2;
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)this_01,
             (IConfig *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  (*(code *)(*(IConfig **)&(this_01->m_info).macroName)[9].super_IShared.super_NonCopyable.
            _vptr_NonCopyable)(this_01,local_70);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_01);
  plVar1 = *(long **)&in_RDI[1].name.field_2;
  (**(code **)(*plVar1 + 0x38))(plVar1,in_RDI[0xe].name.field_2._M_allocated_capacity);
  plVar1 = *(long **)&in_RDI[1].name.field_2;
  (**(code **)(*plVar1 + 0x48))(plVar1,(undefined1 *)((long)&in_RDI[0xe].name.field_2 + 8));
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::~vector((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
             *)this_00);
  AssertionInfo::~AssertionInfo(&this_01->m_info);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_01);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_00);
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)this_01);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_01);
  AssertionResult::~AssertionResult(this_01);
  Option<Catch::SectionTracking::TestCaseTracker>::~Option
            ((Option<Catch::SectionTracking::TestCaseTracker> *)0x25af22);
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x25af30);
  IRunner::~IRunner((IRunner *)&(in_RDI->name)._M_string_length);
  IResultCapture::~IResultCapture((IResultCapture *)in_RDI);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
            m_context.setRunner( m_prevRunner );
            m_context.setConfig( NULL );
            m_context.setResultCapture( m_prevResultCapture );
            m_context.setConfig( m_prevConfig );
        }